

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

void __thiscall
t_markdown_generator::print_fn_args_doc(t_markdown_generator *this,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *poVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pptVar4;
  int iVar5;
  pointer pptVar6;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  string local_90;
  uint local_6c;
  vector<t_field_*,_std::allocator<t_field_*>_> local_68;
  t_function *local_50;
  vector<t_field_*,_std::allocator<t_field_*>_> local_48;
  
  local_50 = tfunction;
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_48,&tfunction->arglist_->members_);
  pptVar6 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar4 = local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar2 = 0;
  }
  else {
    do {
      if ((((*pptVar4)->super_t_doc).has_doc_ == true) &&
         (((*pptVar4)->super_t_doc).doc_._M_string_length != 0)) {
        uVar2 = CONCAT71((int7)((ulong)local_48.
                                       super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish >> 8),1);
        goto LAB_00242581;
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    uVar2 = 0;
LAB_00242581:
    if ((char)uVar2 != '\0') {
      local_6c = (uint)uVar2;
      poVar1 = &this->f_out_;
      local_90._M_dataplus._M_p._0_1_ = 10;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(char *)&local_90,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"* parameters:",0xd);
      local_90._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_90,1);
      if (pptVar6 !=
          local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar5 = 1;
        do {
          poVar3 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,((*pptVar6)->name_)._M_dataplus._M_p,
                     ((*pptVar6)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
          escape_html(&local_90,this,&((*pptVar6)->super_t_doc).doc_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     (char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                      local_90._M_dataplus._M_p._0_1_),local_90._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_
                                    ));
          }
          local_90._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_90,1);
          pptVar6 = pptVar6 + 1;
          iVar5 = iVar5 + 1;
        } while (pptVar6 !=
                 local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      local_90._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_90,1);
      uVar2 = (ulong)local_6c;
    }
  }
  if ((char)uVar2 == '\0') {
    local_90._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,(char *)&local_90,1)
    ;
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_68,&local_50->xceptions_->members_);
  pptVar4 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar6 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (pptVar6 ==
        local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00242814;
    if ((((*pptVar6)->super_t_doc).has_doc_ == true) &&
       (((*pptVar6)->super_t_doc).doc_._M_string_length != 0)) break;
    pptVar6 = pptVar6 + 1;
  }
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"* exceptions:",0xd);
  local_90._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_90,1);
  if (pptVar4 !=
      local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  * ",4);
      iVar5 = (*((*pptVar4)->type_->super_t_doc)._vptr_t_doc[3])();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,*(char **)CONCAT44(extraout_var,iVar5),
                 ((undefined8 *)CONCAT44(extraout_var,iVar5))[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
      escape_html(&local_90,this,&((*pptVar4)->super_t_doc).doc_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 (char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                 local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_));
      }
      local_90._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_90,1);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_90._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_90,1);
LAB_00242814:
  if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_markdown_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << endl << "* parameters:" << endl;
      for (int n = 1; arg_iter != args.end(); ++arg_iter, ++n ) {
        f_out_ << n << ". " << (*arg_iter)->get_name();
        f_out_ << " - " << escape_html((*arg_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
  if(!has_docs) 
    f_out_ << endl;

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ++ex_iter) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty()) {
        has_docs = true;
        break;
      }
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "* exceptions:" << endl;
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "  * " << (*ex_iter)->get_type()->get_name();
        f_out_ << " - ";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << endl;
      }
      f_out_ << endl;
    }
  }
}